

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O0

int SaveAsTGA(FILE *file,aiTexel *data,uint width,uint height)

{
  uint local_44;
  uint local_40;
  uint x;
  uint y;
  TGA_HEADER head;
  uint height_local;
  uint width_local;
  aiTexel *data_local;
  FILE *file_local;
  
  if ((file == (FILE *)0x0) || (data == (aiTexel *)0x0)) {
    file_local._4_4_ = 1;
  }
  else {
    head._10_4_ = height;
    head._14_4_ = width;
    memset((void *)((long)&x + 2),0,0x12);
    head.xstart._0_1_ = 0x20;
    head._6_2_ = head.ystart;
    head._4_2_ = head.height;
    head.xstart._1_1_ = head.xstart._1_1_ | 0x20;
    y._0_1_ = 2;
    fwrite((void *)((long)&x + 2),0x12,1,(FILE *)file);
    for (local_40 = 0; local_40 < (uint)head._10_4_; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < (uint)head._14_4_; local_44 = local_44 + 1) {
        fwrite(data + (ulong)(local_40 * head._14_4_) + (ulong)local_44,4,1,(FILE *)file);
      }
    }
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

int SaveAsTGA (FILE* file, const aiTexel* data, unsigned int width, unsigned int height)
{
    if (!file || !data) {
        return 1;
    }

    TGA_HEADER head;
    memset(&head, 0, sizeof(head));
    head.bits   = 32;
    head.height = (uint16_t)height;
    head.width  = (uint16_t)width;
    head.descriptor |= (1u<<5);

    head.imagetype = 2; // actually it's RGBA
    fwrite(&head,sizeof(TGA_HEADER),1,file);

    for (unsigned int y = 0; y < height; ++y) {
        for (unsigned int x = 0; x < width; ++x) {
            fwrite(data + y*width+x,4,1,file);
        }
    }

    return 0;
}